

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

ptrlen ntru_decode_ciphertext(uint16_t *ct,NTRUKeyPair *keypair,BinarySource *src)

{
  uint q;
  short sVar1;
  uint64_t qrecip;
  NTRUEncodeSchedule *sched;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  short sVar6;
  size_t wanted;
  uint uVar7;
  uint uVar8;
  ptrlen data;
  
  uVar5 = (ulong)keypair->p;
  q = keypair->q;
  sched = ntru_encode_ciphertext_schedule(keypair->p,q);
  if (sched->nops == 0) {
    wanted = 0;
  }
  else {
    sVar3 = 0;
    wanted = 0;
    do {
      wanted = wanted + (sched->ops[sVar3] == 1);
      sVar3 = sVar3 + 1;
    } while (sched->nops != sVar3);
  }
  data = BinarySource_get_data(src->binarysource_,wanted);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    ntru_decode(sched,ct,data);
    safefree(sched->ops);
    safefree(sched);
    lVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0);
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        sVar1 = (short)q;
        sVar6 = (short)((ulong)ct[uVar4] * 3) -
                (short)((ulong)ct[uVar4] * 3 * lVar2 >> 0x30) * sVar1;
        uVar7 = q;
        if ((short)(sVar6 - sVar1) < 0) {
          uVar7 = 0;
        }
        ct[uVar4] = sVar6 - (short)uVar7;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      uVar7 = q >> 1;
      uVar4 = 0;
      do {
        uVar8 = (uint)ct[uVar4] + ~uVar7 + q + ((uVar7 + 1) / 3) * -3 + uVar7 + 1;
        sVar6 = (short)uVar8 - (short)(lVar2 * (ulong)uVar8 >> 0x30) * sVar1;
        uVar8 = q;
        if ((short)(sVar6 - sVar1) < 0) {
          uVar8 = 0;
        }
        ct[uVar4] = sVar6 - (short)uVar8;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  else {
    memset(ct,0,uVar5 * 2);
  }
  return data;
}

Assistant:

ptrlen ntru_decode_ciphertext(uint16_t *ct, NTRUKeyPair *keypair,
                              BinarySource *src)
{
    unsigned p = keypair->p, q = keypair->q;

    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);

    /* Retrieve the right number of bytes from the source */
    size_t len = ntru_encode_schedule_length(sched);
    ptrlen encoded = get_data(src, len);
    if (get_err(src)) {
        /* As above, return deterministic nonsense on failure */
        memset(ct, 0, p*sizeof(*ct));
    } else {
        /* Do the decoding */
        ntru_decode(sched, ct, encoded);
        ntru_encode_schedule_free(sched);

        /* Undo the scaling and bias */
        ntru_scale(ct, ct, 3, p, q);
        ntru_bias(ct, ct, q - 3 * ciphertext_bias(q), p, q);
    }

    return encoded;        /* also useful to the caller, optionally */
}